

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O1

void __thiscall
stateObservation::ZeroDelayObserver::setInput(ZeroDelayObserver *this,InputVector *u_k,TimeIndex k)

{
  _Map_pointer ppMVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((this->super_ObserverBase).p_ < 1) {
    return;
  }
  iVar3 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1c])();
  if ((char)iVar3 != '\0') {
    ppMVar1 = (this->u_).v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar4 = ((((ulong)((long)ppMVar1 -
                      (long)(this->u_).v_.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20;
    lVar7 = (long)(this->u_).v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(this->u_).v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4;
    lVar6 = (long)(this->u_).v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(this->u_).v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4;
    lVar5 = lVar7 + lVar6 + lVar4;
    if (lVar5 < 1) {
      if (((this->x_).
           super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_ ==
           true) && (lVar4 = (this->x_).k_, lVar4 != k + -1 && lVar4 != k)) {
        __assert_fail("(!x_.isSet() || x_.getTime() == k || x_.getTime() == k - 1) && \"ERROR: The time is set incorrectly for the                           inputs (must be [current_time] or [current_time+1])\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                      ,99,
                      "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
                     );
      }
    }
    else {
      lVar2 = (this->u_).k_;
      if ((lVar6 + lVar2 + lVar4 + lVar7 != k) && ((k < lVar2 || (lVar2 + lVar5 <= k)))) {
        __assert_fail("(u_.getNextIndex() == k || u_.checkIndex(k)) && \"ERROR: The time is set incorrectly                                 for the inputs (order or gap)\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                      ,0x5e,
                      "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
                     );
      }
    }
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(&this->u_,u_k,k);
    return;
  }
  __assert_fail("checkInputVector(u_k) && \"The size of the input vector is incorrect\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,0x5a,
                "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
               );
}

Assistant:

void ZeroDelayObserver::setInput(const ObserverBase::InputVector & u_k, TimeIndex k)
{
  if(p_ > 0)
  {
    BOOST_ASSERT(checkInputVector(u_k) && "The size of the input vector is incorrect");

    if(u_.size() > 0)
      BOOST_ASSERT((u_.getNextIndex() == k || u_.checkIndex(k)) && "ERROR: The time is set incorrectly \
                                for the inputs (order or gap)");
    else
    {
      BOOST_ASSERT((!x_.isSet() || x_.getTime() == k || x_.getTime() == k - 1)
                   && "ERROR: The time is set incorrectly for the \
                          inputs (must be [current_time] or [current_time+1])");
    }

    u_.setValue(u_k, k);
  }
}